

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

void __thiscall Handler::DeleteVirtualMachine(Handler *this,int *vmId)

{
  undefined2 uVar1;
  undefined2 uVar3;
  undefined2 uVar4;
  ulong uVar2;
  undefined2 uVar5;
  uint uVar6;
  pointer pDVar7;
  pointer pVVar8;
  pointer pVVar9;
  uint8_t uVar10;
  mapped_type *pmVar11;
  PurchasedServer *purchasedServer;
  undefined1 auVar12 [16];
  uint32_t deployedVMIdx;
  undefined1 local_24 [4];
  
  pmVar11 = std::__detail::
            _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->idDeployedVMMap,vmId);
  uVar6 = *pmVar11;
  pDVar7 = (this->deployedVMs).
           super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar8 = (this->virtualMachines).
           super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar9 = pVVar8 + pDVar7[uVar6].vmIdx;
  uVar2._0_2_ = pVVar9->cpuCore;
  uVar2._2_2_ = pVVar9->memorySize;
  uVar2._4_1_ = pVVar9->nodeType;
  uVar2._5_3_ = *(undefined3 *)&pVVar9->field_0x25;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar2;
  purchasedServer =
       (this->purchasedServers).
       super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
       super__Vector_impl_data._M_start +
       this->purchasedServerIdxMap[pDVar7[uVar6].purchasedServerId];
  if (pVVar8[pDVar7[uVar6].vmIdx].nodeType == true) {
    auVar12 = pshuflw(auVar12,auVar12,0x50);
    uVar1 = purchasedServer->remainCpuCoreA;
    uVar3 = purchasedServer->remainCpuCoreB;
    uVar4 = purchasedServer->remainMemorySizeA;
    uVar5 = purchasedServer->remainMemorySizeB;
    purchasedServer->remainCpuCoreA = uVar1 + (auVar12._0_2_ >> 1);
    purchasedServer->remainCpuCoreB = uVar3 + (auVar12._2_2_ >> 1);
    purchasedServer->remainMemorySizeA = uVar4 + (auVar12._4_2_ >> 1);
    purchasedServer->remainMemorySizeB = uVar5 + (auVar12._6_2_ >> 1);
  }
  else if (pDVar7[uVar6].location == true) {
    purchasedServer->remainCpuCoreA = purchasedServer->remainCpuCoreA + (undefined2)uVar2;
    purchasedServer->remainMemorySizeA = purchasedServer->remainMemorySizeA + uVar2._2_2_;
  }
  else {
    purchasedServer->remainCpuCoreB = purchasedServer->remainCpuCoreB + (undefined2)uVar2;
    purchasedServer->remainMemorySizeB = purchasedServer->remainMemorySizeB + uVar2._2_2_;
  }
  this->deployedVMNum = this->deployedVMNum - 1;
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->idDeployedVMMap)._M_h,vmId);
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->idVirtualMachineMap)._M_h,vmId);
  uVar10 = CalculateVacancyRate(this,purchasedServer);
  purchasedServer->vacancyRate = uVar10;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(purchasedServer->deployedVM)._M_h,local_24);
  return;
}

Assistant:

void Handler::DeleteVirtualMachine(const int &vmId) {
    uint32_t deployedVMIdx = idDeployedVMMap[vmId];
    DeployedVirtualMachine &deployedVM = deployedVMs[deployedVMIdx];
    PurchasedServer &purchasedServer = purchasedServers[purchasedServerIdxMap[deployedVM.purchasedServerId]];
    VirtualMachine &vm = virtualMachines[deployedVM.vmIdx];
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    if (vm.nodeType) {
        purchasedServer.remainCpuCoreA += cpuCore >> 1u;
        purchasedServer.remainCpuCoreB += cpuCore >> 1u;
        purchasedServer.remainMemorySizeA += memorySize >> 1u;
        purchasedServer.remainMemorySizeB += memorySize >> 1u;
    } else {
        if (deployedVM.location) {
            purchasedServer.remainCpuCoreA += cpuCore;
            purchasedServer.remainMemorySizeA += memorySize;
        } else {
            purchasedServer.remainCpuCoreB += cpuCore;
            purchasedServer.remainMemorySizeB += memorySize;
        }
    }

    --deployedVMNum;
    idDeployedVMMap.erase(vmId);
    idVirtualMachineMap.erase(vmId);
    purchasedServer.vacancyRate = CalculateVacancyRate(purchasedServer);
    purchasedServer.deployedVM.erase(deployedVMIdx);
}